

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_execSequenceEnd
                 (BYTE *op,BYTE *oend,seq_t sequence,BYTE **litPtr,BYTE *litLimit,BYTE *prefixStart,
                 BYTE *virtualStart,BYTE *dictEnd)

{
  size_t sVar1;
  BYTE *pBVar2;
  size_t sVar3;
  BYTE *op_00;
  BYTE *ip;
  long lVar4;
  
  sVar1 = sequence.matchLength + sequence.litLength;
  if ((long)sVar1 <= (long)sequence.litLength) {
    __assert_fail("oLitEnd < oMatchEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x635b,
                  "size_t ZSTD_execSequenceEnd(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                 );
  }
  sVar3 = 0xffffffffffffffba;
  if (op + sVar1 <= oend) {
    pBVar2 = *litPtr + sequence.litLength;
    sVar3 = 0xffffffffffffffec;
    if (pBVar2 <= litLimit) {
      op_00 = op + sequence.litLength;
      ip = op_00 + -sequence.offset;
      ZSTD_safecopy(op,oend + -0x20,*litPtr,sequence.litLength,ZSTD_no_overlap);
      *litPtr = pBVar2;
      if ((ulong)((long)op_00 - (long)prefixStart) < sequence.offset) {
        if ((ulong)((long)op_00 - (long)virtualStart) < sequence.offset) {
          return 0xffffffffffffffec;
        }
        lVar4 = (long)ip - (long)prefixStart;
        pBVar2 = dictEnd + lVar4;
        if (pBVar2 + sequence.matchLength <= dictEnd) {
          memmove(op_00,pBVar2,sequence.matchLength);
          return sVar1;
        }
        memmove(op_00,pBVar2,-lVar4);
        op_00 = op_00 + -lVar4;
        sequence.matchLength = sequence.matchLength + lVar4;
        ip = prefixStart;
      }
      ZSTD_safecopy(op_00,oend + -0x20,ip,sequence.matchLength,ZSTD_overlap_src_before_dst);
      sVar3 = sVar1;
    }
  }
  return sVar3;
}

Assistant:

FORCE_NOINLINE
size_t ZSTD_execSequenceEnd(BYTE* op,
                            BYTE* const oend, seq_t sequence,
                            const BYTE** litPtr, const BYTE* const litLimit,
                            const BYTE* const prefixStart, const BYTE* const virtualStart, const BYTE* const dictEnd)
{
    BYTE* const oLitEnd = op + sequence.litLength;
    size_t const sequenceLength = sequence.litLength + sequence.matchLength;
    BYTE* const oMatchEnd = op + sequenceLength;   /* risk : address space overflow (32-bits) */
    const BYTE* const iLitEnd = *litPtr + sequence.litLength;
    const BYTE* match = oLitEnd - sequence.offset;
    BYTE* const oend_w = oend - WILDCOPY_OVERLENGTH;

    /* bounds checks */
    assert(oLitEnd < oMatchEnd);
    RETURN_ERROR_IF(oMatchEnd > oend, dstSize_tooSmall, "last match must fit within dstBuffer");
    RETURN_ERROR_IF(iLitEnd > litLimit, corruption_detected, "try to read beyond literal buffer");

    /* copy literals */
    ZSTD_safecopy(op, oend_w, *litPtr, sequence.litLength, ZSTD_no_overlap);
    op = oLitEnd;
    *litPtr = iLitEnd;

    /* copy Match */
    if (sequence.offset > (size_t)(oLitEnd - prefixStart)) {
        /* offset beyond prefix */
        RETURN_ERROR_IF(sequence.offset > (size_t)(oLitEnd - virtualStart), corruption_detected);
        match = dictEnd - (prefixStart-match);
        if (match + sequence.matchLength <= dictEnd) {
            memmove(oLitEnd, match, sequence.matchLength);
            return sequenceLength;
        }
        /* span extDict & currentPrefixSegment */
        {   size_t const length1 = dictEnd - match;
            memmove(oLitEnd, match, length1);
            op = oLitEnd + length1;
            sequence.matchLength -= length1;
            match = prefixStart;
    }   }
    ZSTD_safecopy(op, oend_w, match, sequence.matchLength, ZSTD_overlap_src_before_dst);
    return sequenceLength;
}